

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O1

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,OPJ_UINT32 win_x0,OPJ_UINT32 win_y0,OPJ_UINT32 win_x1,
                            OPJ_UINT32 win_y1,OPJ_UINT32 numcomps_to_decode,
                            OPJ_UINT32 *comps_indices,OPJ_BYTE *p_src,OPJ_UINT32 p_max_length,
                            OPJ_UINT32 p_tile_no,opj_codestream_index_t *p_cstr_index,
                            opj_event_mgr_t *p_manager)

{
  uint *puVar1;
  int iVar2;
  opj_tcd_tile_t *poVar3;
  opj_tcp_t *poVar4;
  opj_tcd_resolution_t *poVar5;
  opj_image_comp_t *poVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  OPJ_BOOL OVar11;
  OPJ_BOOL *pOVar12;
  opj_t2_t *p_t2;
  opj_mutex_t *p_manager_mutex;
  opj_tcd_resolution_t *poVar13;
  opj_image_t *poVar14;
  long lVar15;
  void *pvVar16;
  OPJ_BYTE **pData;
  OPJ_INT32 **ppOVar17;
  byte bVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  OPJ_INT32 *c2;
  OPJ_FLOAT32 *c2_00;
  float fVar25;
  float fVar26;
  ulong uVar27;
  ulong uVar28;
  OPJ_INT32 *c1;
  OPJ_FLOAT32 *c1_00;
  float fVar29;
  OPJ_INT32 *c0;
  OPJ_FLOAT32 *c0_00;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  int *piVar33;
  opj_tcd_tilecomp_t *poVar34;
  OPJ_UINT32 *pOVar35;
  opj_tccp_t *poVar36;
  int iVar37;
  float fVar38;
  OPJ_UINT32 *pOVar39;
  long lVar40;
  long lVar41;
  float *pfVar42;
  OPJ_SIZE_T n;
  OPJ_BOOL local_74;
  opj_image_t *local_70;
  ulong local_68;
  int local_5c;
  uint local_58;
  OPJ_UINT32 l_data_read;
  opj_tcd_tilecomp_t *local_50;
  opj_image_comp_t *local_48;
  opj_tcd_tile_t *local_40;
  ulong local_38;
  
  p_tcd->tcd_tileno = p_tile_no;
  p_tcd->tcp = p_tcd->cp->tcps + p_tile_no;
  p_tcd->win_x0 = win_x0;
  p_tcd->win_y0 = win_y0;
  p_tcd->win_x1 = win_x1;
  p_tcd->win_y1 = win_y1;
  p_tcd->whole_tile_decoding = 1;
  opj_free(p_tcd->used_component);
  p_tcd->used_component = (OPJ_BOOL *)0x0;
  if (numcomps_to_decode != 0) {
    pOVar12 = (OPJ_BOOL *)opj_calloc(4,(ulong)p_tcd->image->numcomps);
    if (pOVar12 == (OPJ_BOOL *)0x0) {
      return 0;
    }
    uVar27 = 0;
    do {
      pOVar12[comps_indices[uVar27]] = 1;
      uVar27 = uVar27 + 1;
    } while (numcomps_to_decode != uVar27);
    p_tcd->used_component = pOVar12;
    if (pOVar12 == (OPJ_BOOL *)0x0) {
      return 0;
    }
  }
  local_70 = p_tcd->image;
  if ((ulong)local_70->numcomps != 0) {
    lVar40 = 4;
    lVar41 = 0;
    piVar33 = p_tcd->used_component;
    do {
      if ((p_tcd->used_component == (int *)0x0) || (*piVar33 != 0)) {
        uVar27 = (ulong)*(uint *)((long)local_70->comps + lVar40 + -4);
        if (uVar27 == 0) goto LAB_00139b63;
        uVar28 = (ulong)*(uint *)((long)&local_70->comps->dx + lVar40);
        if (uVar28 == 0) goto LAB_00139b63;
        poVar34 = p_tcd->tcd_image->tiles->comps;
        uVar19 = *(int *)((long)&poVar34->numresolutions + lVar41) -
                 *(int *)((long)&poVar34->minimum_num_resolutions + lVar41);
        if (uVar19 < 0x20) {
          puVar1 = (uint *)((long)&poVar34->x0 + lVar41);
          uVar23 = (uint)(((p_tcd->win_x0 + uVar27) - 1) / uVar27);
          uVar30 = 0;
          if (*puVar1 <= uVar23) {
            uVar30 = uVar23 - *puVar1;
          }
          bVar18 = (byte)uVar19;
          if (uVar30 >> (bVar18 & 0x1f) == 0) {
            puVar1 = (uint *)((long)&poVar34->y0 + lVar41);
            uVar30 = (uint)(((p_tcd->win_y0 + uVar28) - 1) / uVar28);
            uVar19 = 0 >> (bVar18 & 0x1f);
            if (*puVar1 <= uVar30) {
              uVar19 = uVar30 - *puVar1;
            }
            if (uVar19 >> (bVar18 & 0x1f) == 0) {
              uVar19 = *(uint *)((long)&poVar34->x1 + lVar41);
              uVar23 = (uint)(((ulong)p_tcd->win_x1 + (uVar27 - 1)) / uVar27);
              uVar30 = 0 >> (bVar18 & 0x1f);
              if (uVar23 <= uVar19) {
                uVar30 = uVar19 - uVar23;
              }
              if (uVar30 >> (bVar18 & 0x1f) == 0) {
                uVar19 = *(uint *)((long)&poVar34->y1 + lVar41);
                uVar23 = (uint)(((p_tcd->win_y1 + uVar28) - 1) / uVar28);
                uVar30 = 0 >> (bVar18 & 0x1f);
                if (uVar23 <= uVar19) {
                  uVar30 = uVar19 - uVar23;
                }
                if (uVar30 >> (bVar18 & 0x1f) == 0) goto LAB_00138fa6;
              }
            }
          }
          p_tcd->whole_tile_decoding = 0;
          break;
        }
      }
LAB_00138fa6:
      piVar33 = piVar33 + 1;
      lVar41 = lVar41 + 0x70;
      lVar40 = lVar40 + 0x40;
    } while ((ulong)local_70->numcomps * 0x70 - lVar41 != 0);
  }
  poVar14 = p_tcd->image;
  if (p_tcd->whole_tile_decoding == 0) {
    if (poVar14->numcomps != 0) {
      uVar27 = 0;
      do {
        poVar34 = p_tcd->tcd_image->tiles->comps + uVar27;
        poVar6 = poVar14->comps;
        if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar27] != 0)) {
          uVar28 = CONCAT44(0,poVar6[uVar27].dx);
          if (uVar28 == 0) {
LAB_00139b63:
            __assert_fail("b",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/opj_intmath.h"
                          ,0xac,"OPJ_UINT32 opj_uint_ceildiv(OPJ_UINT32, OPJ_UINT32)");
          }
          auVar7._8_8_ = 0;
          auVar7._0_8_ = uVar28;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = (p_tcd->win_x0 + uVar28) - 1;
          uVar21 = SUB168(auVar8 / auVar7,0) & 0xffffffff;
          if (SUB164(auVar8 / auVar7,0) < (uint)poVar34->x0) {
            uVar21 = (ulong)(uint)poVar34->x0;
          }
          poVar34->win_x0 = (uint)uVar21;
          uVar32 = (ulong)poVar6[uVar27].dy;
          if (uVar32 == 0) goto LAB_00139b63;
          uVar19 = (uint)(((p_tcd->win_y0 + uVar32) - 1) / uVar32);
          if (uVar19 < (uint)poVar34->y0) {
            uVar19 = poVar34->y0;
          }
          poVar34->win_y0 = uVar19;
          uVar30 = (uint)(((p_tcd->win_x1 + uVar28) - 1) / uVar28);
          if ((uint)poVar34->x1 < uVar30) {
            uVar30 = poVar34->x1;
          }
          poVar34->win_x1 = uVar30;
          uVar23 = (uint)(((p_tcd->win_y1 + uVar32) - 1) / uVar32);
          if ((uint)poVar34->y1 < uVar23) {
            uVar23 = poVar34->y1;
          }
          poVar34->win_y1 = uVar23;
          if ((uVar30 < (uint)uVar21) || (uVar23 < uVar19)) {
            opj_event_msg(p_manager,1,"Invalid tilec->win_xxx values\n");
            iVar22 = 1;
          }
          else {
            uVar20 = poVar34->numresolutions;
            uVar28 = (ulong)uVar20;
            iVar22 = 0;
            if (uVar28 != 0) {
              poVar5 = poVar34->resolutions;
              lVar40 = 0;
              do {
                uVar20 = uVar20 - 1;
                bVar18 = (byte)uVar20;
                lVar41 = 1L << (bVar18 & 0x3f);
                *(int *)((long)&poVar5->win_x0 + lVar40) =
                     (int)((lVar41 + uVar21) - 1 >> (bVar18 & 0x3f));
                *(int *)((long)&poVar5->win_y0 + lVar40) =
                     (int)((lVar41 + (ulong)uVar19) - 1 >> (bVar18 & 0x3f));
                *(int *)((long)&poVar5->win_x1 + lVar40) =
                     (int)((lVar41 + (ulong)uVar30) - 1 >> (bVar18 & 0x3f));
                *(int *)((long)&poVar5->win_y1 + lVar40) =
                     (int)((lVar41 + (ulong)uVar23) - 1 >> (bVar18 & 0x3f));
                lVar40 = lVar40 + 0xc0;
                iVar22 = 0;
              } while (uVar28 * 0xc0 != lVar40);
            }
          }
        }
        else {
          iVar22 = 0xd;
        }
        if ((iVar22 != 0xd) && (iVar22 != 0)) {
          return 0;
        }
        uVar27 = uVar27 + 1;
        poVar14 = p_tcd->image;
      } while (uVar27 < poVar14->numcomps);
    }
  }
  else if (poVar14->numcomps != 0) {
    lVar40 = 0;
    uVar27 = 0;
    do {
      poVar34 = p_tcd->tcd_image->tiles->comps;
      lVar41 = *(long *)((long)&poVar34->resolutions + lVar40);
      lVar31 = (ulong)(*(int *)((long)&poVar34->minimum_num_resolutions + lVar40) - 1) * 0xc0;
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar27] != 0)) {
        uVar28 = (long)*(int *)(lVar41 + 8 + lVar31) - (long)*(int *)(lVar41 + lVar31);
        iVar22 = *(int *)(lVar41 + 0xc + lVar31) - *(int *)(lVar41 + 4 + lVar31);
        if (((iVar22 == 0) ||
            (auVar9._8_8_ = 0, auVar9._0_8_ = (long)iVar22, auVar10._8_8_ = 0,
            auVar10._0_8_ = uVar28, SUB168(auVar9 * auVar10,8) == 0)) &&
           (uVar28 = (long)iVar22 * uVar28, uVar28 < 0x4000000000000000)) {
          *(ulong *)((long)&poVar34->data_size_needed + lVar40) = uVar28 * 4;
          OVar11 = opj_alloc_tile_component_data
                             ((opj_tcd_tilecomp_t *)((long)&poVar34->x0 + lVar40));
          iVar22 = 0;
          if (OVar11 != 0) goto LAB_00139096;
        }
        iVar22 = 1;
        opj_event_msg(p_manager,1,"Size of tile data exceeds system limits\n");
      }
      else {
        iVar22 = 10;
      }
LAB_00139096:
      if ((iVar22 != 10) && (iVar22 != 0)) {
        return 0;
      }
      uVar27 = uVar27 + 1;
      lVar40 = lVar40 + 0x70;
    } while (uVar27 < p_tcd->image->numcomps);
  }
  l_data_read = 0;
  p_t2 = opj_t2_create(p_tcd->image,p_tcd->cp);
  if (p_t2 == (opj_t2_t *)0x0) {
    return 0;
  }
  OVar11 = opj_t2_decode_packets
                     (p_tcd,p_t2,p_tcd->tcd_tileno,p_tcd->tcd_image->tiles,p_src,&l_data_read,
                      p_max_length,p_cstr_index,p_manager);
  opj_t2_destroy(p_t2);
  if (OVar11 == 0) {
    return 0;
  }
  poVar3 = p_tcd->tcd_image->tiles;
  poVar34 = poVar3->comps;
  poVar36 = p_tcd->tcp->tccps;
  local_74 = 1;
  p_manager_mutex = opj_mutex_create();
  uVar19 = 0;
  if (p_tcd->tcp->num_layers_to_decode == p_tcd->tcp->numlayers) {
    uVar19 = poVar36->cblksty >> 4 & 1;
  }
  if (poVar3->numcomps != 0) {
    uVar27 = 0;
    do {
      if (((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar27] != 0)) &&
         (opj_t1_decode_cblks(p_tcd,&local_74,poVar34,poVar36,p_manager,p_manager_mutex,uVar19),
         local_74 == 0)) break;
      uVar27 = uVar27 + 1;
      poVar34 = poVar34 + 1;
      poVar36 = poVar36 + 1;
    } while (uVar27 < poVar3->numcomps);
  }
  opj_thread_pool_wait_completion(p_tcd->thread_pool,0);
  if (p_manager_mutex != (opj_mutex_t *)0x0) {
    opj_mutex_destroy(p_manager_mutex);
  }
  if (local_74 == 0) {
    return 0;
  }
  if ((p_tcd->whole_tile_decoding == 0) && (poVar14 = p_tcd->image, poVar14->numcomps != 0)) {
    lVar40 = 0x14;
    lVar41 = 9;
    uVar27 = 0;
    do {
      poVar34 = p_tcd->tcd_image->tiles->comps;
      lVar15 = (ulong)(&poVar14->comps->dx)[lVar41] * 0xc0;
      lVar31 = *(long *)((long)poVar34 + lVar40 * 4 + -0x30);
      iVar22 = *(int *)(lVar31 + 0xb8 + lVar15);
      iVar37 = *(int *)(lVar31 + 0xb0 + lVar15);
      local_70 = (opj_image_t *)CONCAT44(local_70._4_4_,*(undefined4 *)(lVar31 + 0xb4 + lVar15));
      iVar2 = *(int *)(lVar31 + 0xbc + lVar15);
      opj_image_data_free(*(void **)(&poVar34->x0 + lVar40));
      *(undefined8 *)(&poVar34->x0 + lVar40) = 0;
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar27] != 0)) {
        iVar24 = 0;
        if (iVar2 != (int)local_70 && iVar22 != iVar37) {
          uVar28 = (ulong)(uint)(iVar2 - (int)local_70) * (ulong)(uint)(iVar22 - iVar37);
          if (uVar28 < 0x4000000000000000) {
            pvVar16 = opj_image_data_alloc(uVar28 * 4);
            iVar24 = 0;
            *(void **)(&poVar34->x0 + lVar40) = pvVar16;
            if (pvVar16 != (void *)0x0) goto LAB_001397de;
          }
          opj_event_msg(p_manager,1,"Size of tile data exceeds system limits\n");
          iVar24 = 1;
        }
      }
      else {
        iVar24 = 0x13;
      }
LAB_001397de:
      if ((iVar24 != 0x13) && (iVar24 != 0)) {
        return 0;
      }
      uVar27 = uVar27 + 1;
      poVar14 = p_tcd->image;
      lVar40 = lVar40 + 0x1c;
      lVar41 = lVar41 + 0x10;
    } while (uVar27 < poVar14->numcomps);
  }
  poVar3 = p_tcd->tcd_image->tiles;
  if (poVar3->numcomps != 0) {
    poVar34 = poVar3->comps;
    pOVar35 = &p_tcd->image->comps->resno_decoded;
    pOVar39 = &p_tcd->tcp->tccps->qmfbid;
    uVar27 = 0;
    do {
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[uVar27] != 0)) {
        if (*pOVar39 == 1) {
          iVar22 = opj_dwt_decode(p_tcd,poVar34,*pOVar35 + 1);
        }
        else {
          iVar22 = opj_dwt_decode_real(p_tcd,poVar34,*pOVar35 + 1);
        }
        if (iVar22 == 0) {
          return 0;
        }
      }
      uVar27 = uVar27 + 1;
      poVar34 = poVar34 + 1;
      pOVar35 = pOVar35 + 0x10;
      pOVar39 = pOVar39 + 0x10e;
    } while (uVar27 < poVar3->numcomps);
  }
  poVar4 = p_tcd->tcp;
  if ((poVar4->mct == 0) || (p_tcd->used_component != (OPJ_BOOL *)0x0)) goto LAB_0013947e;
  poVar3 = p_tcd->tcd_image->tiles;
  poVar34 = poVar3->comps;
  iVar22 = p_tcd->whole_tile_decoding;
  poVar5 = poVar34->resolutions;
  if (iVar22 == 0) {
    poVar6 = p_tcd->image->comps;
    uVar19 = poVar6->resno_decoded;
    n = (ulong)(poVar5[uVar19].win_y1 - poVar5[uVar19].win_y0) *
        (ulong)(poVar5[uVar19].win_x1 - poVar5[uVar19].win_x0);
    if (2 < poVar3->numcomps) {
      uVar30 = poVar6[1].resno_decoded;
      uVar23 = poVar6[2].resno_decoded;
      if ((uVar19 != uVar23 || uVar30 != uVar19) ||
         (poVar5 = poVar34[1].resolutions,
         (ulong)(poVar5[uVar30].win_y1 - poVar5[uVar30].win_y0) *
         (ulong)(poVar5[uVar30].win_x1 - poVar5[uVar30].win_x0) - n != 0)) goto LAB_00139aa5;
      poVar5 = poVar34[2].resolutions;
      uVar27 = (ulong)(poVar5[uVar23].win_x1 - poVar5[uVar23].win_x0);
      uVar28 = (ulong)(poVar5[uVar23].win_y1 - poVar5[uVar23].win_y0);
      goto LAB_001399e4;
    }
  }
  else {
    uVar19 = poVar34->minimum_num_resolutions;
    n = ((long)poVar5[(ulong)uVar19 - 1].y1 - (long)poVar5[(ulong)uVar19 - 1].y0) *
        ((long)poVar5[(ulong)uVar19 - 1].x1 - (long)poVar5[(ulong)uVar19 - 1].x0);
    if (2 < poVar3->numcomps) {
      if ((uVar19 != poVar34[1].minimum_num_resolutions) ||
         (uVar19 != poVar34[2].minimum_num_resolutions)) goto LAB_00139aa5;
      poVar6 = p_tcd->image->comps;
      if ((poVar6->resno_decoded != poVar6[1].resno_decoded) ||
         ((poVar6->resno_decoded != poVar6[2].resno_decoded ||
          (poVar5 = poVar34[1].resolutions,
          ((long)poVar5[(ulong)uVar19 - 1].y1 - (long)poVar5[(ulong)uVar19 - 1].y0) *
          ((long)poVar5[(ulong)uVar19 - 1].x1 - (long)poVar5[(ulong)uVar19 - 1].x0) - n != 0))))
      goto LAB_00139aa5;
      poVar5 = poVar34[2].resolutions;
      uVar27 = (long)poVar5[(ulong)uVar19 - 1].x1 - (long)poVar5[(ulong)uVar19 - 1].x0;
      uVar28 = (long)poVar5[(ulong)uVar19 - 1].y1 - (long)poVar5[(ulong)uVar19 - 1].y0;
LAB_001399e4:
      if (uVar28 * uVar27 - n != 0) {
LAB_00139aa5:
        opj_event_msg(p_manager,1,"Tiles don\'t all have the same dimension. Skip the MCT step.\n");
        return 0;
      }
    }
  }
  if ((ulong)poVar3->numcomps < 3) {
    opj_event_msg(p_manager,1,
                  "Number of components (%d) is inconsistent with a MCT. Skip the MCT step.\n");
  }
  else if (poVar4->mct == 2) {
    if (poVar4->m_mct_decoding_matrix != (OPJ_FLOAT32 *)0x0) {
      pData = (OPJ_BYTE **)opj_malloc((ulong)poVar3->numcomps << 3);
      if (pData == (OPJ_BYTE **)0x0) {
        return 0;
      }
      uVar19 = poVar3->numcomps;
      if ((ulong)uVar19 != 0) {
        ppOVar17 = &poVar34->data + (ulong)(p_tcd->whole_tile_decoding == 0) * 4;
        uVar27 = 0;
        do {
          pData[uVar27] = (OPJ_BYTE *)*ppOVar17;
          uVar27 = uVar27 + 1;
          ppOVar17 = ppOVar17 + 0xe;
        } while (uVar19 != uVar27);
      }
      OVar11 = opj_mct_decode_custom
                         ((OPJ_BYTE *)poVar4->m_mct_decoding_matrix,n,pData,uVar19,
                          p_tcd->image->comps->sgnd);
      opj_free(pData);
      if (OVar11 == 0) {
        return 0;
      }
    }
  }
  else if (poVar4->tccps->qmfbid == 1) {
    if (iVar22 == 0) {
      c0 = poVar34->data_win;
      c1 = poVar34[1].data_win;
      c2 = poVar34[2].data_win;
    }
    else {
      c0 = poVar34->data;
      c1 = poVar34[1].data;
      c2 = poVar34[2].data;
    }
    opj_mct_decode(c0,c1,c2,n);
  }
  else {
    if (iVar22 == 0) {
      c0_00 = (OPJ_FLOAT32 *)poVar34->data_win;
      c1_00 = (OPJ_FLOAT32 *)poVar34[1].data_win;
      c2_00 = (OPJ_FLOAT32 *)poVar34[2].data_win;
    }
    else {
      c0_00 = (OPJ_FLOAT32 *)poVar34->data;
      c1_00 = (OPJ_FLOAT32 *)poVar34[1].data;
      c2_00 = (OPJ_FLOAT32 *)poVar34[2].data;
    }
    opj_mct_decode_real(c0_00,c1_00,c2_00,n);
  }
LAB_0013947e:
  local_40 = p_tcd->tcd_image->tiles;
  if (local_40->numcomps != 0) {
    local_48 = p_tcd->image->comps;
    poVar36 = p_tcd->tcp->tccps;
    local_50 = local_40->comps;
    local_68 = 0;
    do {
      if ((p_tcd->used_component == (OPJ_BOOL *)0x0) || (p_tcd->used_component[local_68] != 0)) {
        poVar5 = local_50->resolutions;
        poVar13 = poVar5 + local_48->resno_decoded;
        if (p_tcd->whole_tile_decoding == 0) {
          iVar22 = poVar13->win_x1 - poVar13->win_x0;
          uVar30 = poVar13->win_y1 - poVar13->win_y0;
          pfVar42 = (float *)local_50->data_win;
          uVar19 = 0;
        }
        else {
          iVar22 = poVar13->x1 - poVar13->x0;
          uVar19 = local_50->minimum_num_resolutions - 1;
          uVar23 = poVar5[uVar19].x1 - poVar5[uVar19].x0;
          uVar19 = uVar23 - iVar22;
          pfVar42 = (float *)local_50->data;
          uVar30 = poVar13->y1 - poVar13->y0;
          if (uVar30 == 0) {
            uVar30 = 0;
          }
          else if (local_50->data_size / (ulong)uVar30 < (ulong)uVar23) {
            __assert_fail("l_height == 0 || l_width + l_stride <= l_tile_comp->data_size / l_height"
                          ,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jarrelscy[P]openjpeg/src/lib/openjp2/tcd.c"
                          ,0x8a0,"OPJ_BOOL opj_tcd_dc_level_shift_decode(opj_tcd_t *)");
          }
        }
        bVar18 = (byte)local_48->prec;
        if (local_48->sgnd == 0) {
          fVar38 = (float)~(-1 << (bVar18 & 0x1f));
          fVar25 = 0.0;
        }
        else {
          iVar37 = 1 << (bVar18 - 1 & 0x1f);
          fVar25 = (float)-iVar37;
          fVar38 = (float)(iVar37 + -1);
        }
        if (poVar36->qmfbid == 1) {
          if (uVar30 != 0) {
            uVar23 = 0;
            iVar37 = iVar22;
            do {
              for (; iVar37 != 0; iVar37 = iVar37 + -1) {
                fVar26 = (float)(poVar36->m_dc_level_shift + (int)*pfVar42);
                fVar29 = fVar38;
                if ((int)fVar26 < (int)fVar38) {
                  fVar29 = fVar26;
                }
                if ((int)fVar26 < (int)fVar25) {
                  fVar29 = fVar25;
                }
                *pfVar42 = fVar29;
                pfVar42 = pfVar42 + 1;
              }
              pfVar42 = pfVar42 + uVar19;
              uVar23 = uVar23 + 1;
              iVar37 = iVar22;
            } while (uVar23 != uVar30);
          }
        }
        else if (uVar30 != 0) {
          local_70 = (opj_image_t *)(long)(int)fVar25;
          local_38 = (ulong)uVar19;
          uVar19 = 0;
          local_5c = iVar22;
          do {
            for (; local_58 = uVar19, iVar22 != 0; iVar22 = iVar22 + -1) {
              fVar29 = *pfVar42;
              fVar26 = fVar38;
              if ((fVar29 <= 2.1474836e+09) && (fVar26 = fVar25, -2.1474836e+09 <= fVar29)) {
                lVar41 = lrintf(fVar29);
                lVar41 = poVar36->m_dc_level_shift + lVar41;
                lVar40 = lVar41;
                if ((int)fVar38 <= lVar41) {
                  lVar40 = (long)(int)fVar38;
                }
                fVar26 = (float)lVar40;
                if (lVar41 < (long)local_70) {
                  fVar26 = fVar25;
                }
              }
              *pfVar42 = fVar26;
              pfVar42 = pfVar42 + 1;
              uVar19 = local_58;
            }
            pfVar42 = pfVar42 + local_38;
            uVar19 = local_58 + 1;
            iVar22 = local_5c;
          } while (local_58 + 1 != uVar30);
        }
      }
      local_68 = local_68 + 1;
      local_48 = local_48 + 1;
      poVar36 = poVar36 + 1;
      local_50 = local_50 + 1;
    } while (local_68 < local_40->numcomps);
  }
  return 1;
}

Assistant:

OPJ_BOOL opj_tcd_decode_tile(opj_tcd_t *p_tcd,
                             OPJ_UINT32 win_x0,
                             OPJ_UINT32 win_y0,
                             OPJ_UINT32 win_x1,
                             OPJ_UINT32 win_y1,
                             OPJ_UINT32 numcomps_to_decode,
                             const OPJ_UINT32 *comps_indices,
                             OPJ_BYTE *p_src,
                             OPJ_UINT32 p_max_length,
                             OPJ_UINT32 p_tile_no,
                             opj_codestream_index_t *p_cstr_index,
                             opj_event_mgr_t *p_manager
                            )
{
    OPJ_UINT32 l_data_read;
    OPJ_UINT32 compno;

    p_tcd->tcd_tileno = p_tile_no;
    p_tcd->tcp = &(p_tcd->cp->tcps[p_tile_no]);
    p_tcd->win_x0 = win_x0;
    p_tcd->win_y0 = win_y0;
    p_tcd->win_x1 = win_x1;
    p_tcd->win_y1 = win_y1;
    p_tcd->whole_tile_decoding = OPJ_TRUE;

    opj_free(p_tcd->used_component);
    p_tcd->used_component = NULL;

    if (numcomps_to_decode) {
        OPJ_BOOL* used_component = (OPJ_BOOL*) opj_calloc(sizeof(OPJ_BOOL),
                                   p_tcd->image->numcomps);
        if (used_component == NULL) {
            return OPJ_FALSE;
        }
        for (compno = 0; compno < numcomps_to_decode; compno++) {
            used_component[ comps_indices[compno] ] = OPJ_TRUE;
        }

        p_tcd->used_component = used_component;
    }

    for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
        if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
            continue;
        }

        if (!opj_tcd_is_whole_tilecomp_decoding(p_tcd, compno)) {
            p_tcd->whole_tile_decoding = OPJ_FALSE;
            break;
        }
    }

    if (p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_tcd_resolution_t *l_res = &
                                          (tilec->resolutions[tilec->minimum_num_resolutions - 1]);
            OPJ_SIZE_T l_data_size;

            /* compute l_data_size with overflow check */
            OPJ_SIZE_T res_w = (OPJ_SIZE_T)(l_res->x1 - l_res->x0);
            OPJ_SIZE_T res_h = (OPJ_SIZE_T)(l_res->y1 - l_res->y0);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* issue 733, l_data_size == 0U, probably something wrong should be checked before getting here */
            if (res_h > 0 && res_w > SIZE_MAX / res_h) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size = res_w * res_h;

            if (SIZE_MAX / sizeof(OPJ_UINT32) < l_data_size) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
            l_data_size *= sizeof(OPJ_UINT32);

            tilec->data_size_needed = l_data_size;

            if (!opj_alloc_tile_component_data(tilec)) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Size of tile data exceeds system limits\n");
                return OPJ_FALSE;
            }
        }
    } else {
        /* Compute restricted tile-component and tile-resolution coordinates */
        /* of the window of interest, but defer the memory allocation until */
        /* we know the resno_decoded */
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            OPJ_UINT32 resno;
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            /* Compute the intersection of the area of interest, expressed in tile coordinates */
            /* with the tile coordinates */
            tilec->win_x0 = opj_uint_max(
                                (OPJ_UINT32)tilec->x0,
                                opj_uint_ceildiv(p_tcd->win_x0, image_comp->dx));
            tilec->win_y0 = opj_uint_max(
                                (OPJ_UINT32)tilec->y0,
                                opj_uint_ceildiv(p_tcd->win_y0, image_comp->dy));
            tilec->win_x1 = opj_uint_min(
                                (OPJ_UINT32)tilec->x1,
                                opj_uint_ceildiv(p_tcd->win_x1, image_comp->dx));
            tilec->win_y1 = opj_uint_min(
                                (OPJ_UINT32)tilec->y1,
                                opj_uint_ceildiv(p_tcd->win_y1, image_comp->dy));
            if (tilec->win_x1 < tilec->win_x0 ||
                    tilec->win_y1 < tilec->win_y0) {
                /* We should not normally go there. The circumstance is when */
                /* the tile coordinates do not intersect the area of interest */
                /* Upper level logic should not even try to decode that tile */
                opj_event_msg(p_manager, EVT_ERROR,
                              "Invalid tilec->win_xxx values\n");
                return OPJ_FALSE;
            }

            for (resno = 0; resno < tilec->numresolutions; ++resno) {
                opj_tcd_resolution_t *res = tilec->resolutions + resno;
                res->win_x0 = opj_uint_ceildivpow2(tilec->win_x0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y0 = opj_uint_ceildivpow2(tilec->win_y0,
                                                   tilec->numresolutions - 1 - resno);
                res->win_x1 = opj_uint_ceildivpow2(tilec->win_x1,
                                                   tilec->numresolutions - 1 - resno);
                res->win_y1 = opj_uint_ceildivpow2(tilec->win_y1,
                                                   tilec->numresolutions - 1 - resno);
            }
        }
    }

#ifdef TODO_MSD /* FIXME */
    /* INDEX >>  */
    if (p_cstr_info) {
        OPJ_UINT32 resno, compno, numprec = 0;
        for (compno = 0; compno < (OPJ_UINT32) p_cstr_info->numcomps; compno++) {
            opj_tcp_t *tcp = &p_tcd->cp->tcps[0];
            opj_tccp_t *tccp = &tcp->tccps[compno];
            opj_tcd_tilecomp_t *tilec_idx = &p_tcd->tcd_image->tiles->comps[compno];
            for (resno = 0; resno < tilec_idx->numresolutions; resno++) {
                opj_tcd_resolution_t *res_idx = &tilec_idx->resolutions[resno];
                p_cstr_info->tile[p_tile_no].pw[resno] = res_idx->pw;
                p_cstr_info->tile[p_tile_no].ph[resno] = res_idx->ph;
                numprec += res_idx->pw * res_idx->ph;
                p_cstr_info->tile[p_tile_no].pdx[resno] = tccp->prcw[resno];
                p_cstr_info->tile[p_tile_no].pdy[resno] = tccp->prch[resno];
            }
        }
        p_cstr_info->tile[p_tile_no].packet = (opj_packet_info_t *) opj_malloc(
                p_cstr_info->numlayers * numprec * sizeof(opj_packet_info_t));
        p_cstr_info->packno = 0;
    }
    /* << INDEX */
#endif

    /*--------------TIER2------------------*/
    /* FIXME _ProfStart(PGROUP_T2); */
    l_data_read = 0;
    if (! opj_tcd_t2_decode(p_tcd, p_src, &l_data_read, p_max_length, p_cstr_index,
                            p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T2); */

    /*------------------TIER1-----------------*/

    /* FIXME _ProfStart(PGROUP_T1); */
    if (! opj_tcd_t1_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_T1); */


    /* For subtile decoding, now we know the resno_decoded, we can allocate */
    /* the tile data buffer */
    if (!p_tcd->whole_tile_decoding) {
        for (compno = 0; compno < p_tcd->image->numcomps; compno++) {
            opj_tcd_tilecomp_t* tilec = &(p_tcd->tcd_image->tiles->comps[compno]);
            opj_image_comp_t* image_comp = &(p_tcd->image->comps[compno]);
            opj_tcd_resolution_t *res = tilec->resolutions + image_comp->resno_decoded;
            OPJ_SIZE_T w = res->win_x1 - res->win_x0;
            OPJ_SIZE_T h = res->win_y1 - res->win_y0;
            OPJ_SIZE_T l_data_size;

            opj_image_data_free(tilec->data_win);
            tilec->data_win = NULL;

            if (p_tcd->used_component != NULL && !p_tcd->used_component[compno]) {
                continue;
            }

            if (w > 0 && h > 0) {
                if (w > SIZE_MAX / h) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size = w * h;
                if (l_data_size > SIZE_MAX / sizeof(OPJ_INT32)) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
                l_data_size *= sizeof(OPJ_INT32);

                tilec->data_win = (OPJ_INT32*) opj_image_data_alloc(l_data_size);
                if (tilec->data_win == NULL) {
                    opj_event_msg(p_manager, EVT_ERROR,
                                  "Size of tile data exceeds system limits\n");
                    return OPJ_FALSE;
                }
            }
        }
    }

    /*----------------DWT---------------------*/

    /* FIXME _ProfStart(PGROUP_DWT); */
    if
    (! opj_tcd_dwt_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DWT); */

    /*----------------MCT-------------------*/
    /* FIXME _ProfStart(PGROUP_MCT); */
    if
    (! opj_tcd_mct_decode(p_tcd, p_manager)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_MCT); */

    /* FIXME _ProfStart(PGROUP_DC_SHIFT); */
    if
    (! opj_tcd_dc_level_shift_decode(p_tcd)) {
        return OPJ_FALSE;
    }
    /* FIXME _ProfStop(PGROUP_DC_SHIFT); */


    /*---------------TILE-------------------*/
    return OPJ_TRUE;
}